

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shmfilelockmgr.cpp
# Opt level: O3

PAL_ERROR __thiscall
CorUnix::CSharedMemoryFileLockMgr::GetFileShareModeForFile
          (CSharedMemoryFileLockMgr *this,LPCSTR szFileName,DWORD *pdwShareMode)

{
  SHMPTR shmFileLocks_00;
  PAL_ERROR PVar1;
  LPVOID pvVar2;
  SHMPTR local_30;
  SHMPTR shmFileLocks;
  
  *pdwShareMode = 0xffffffff;
  local_30 = 0;
  SHMLock();
  PVar1 = FILEGetSHMFileLocks(szFileName,&local_30,1);
  shmFileLocks_00 = local_30;
  if (local_30 == 0 || PVar1 != 0) {
    if (local_30 == 0) goto LAB_0032fbb6;
  }
  else {
    pvVar2 = SHMPtrToPtr(local_30);
    if (pvVar2 == (LPVOID)0x0) {
      fprintf(_stderr,"] %s %s:%d","GetFileShareModeForFile",
              "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/file/shmfilelockmgr.cpp"
              ,0x11e);
      fprintf(_stderr,"Unable to get pointer from shm pointer.\n");
      PVar1 = 0x54f;
    }
    else {
      *pdwShareMode = *(DWORD *)((long)pvVar2 + 0x28);
      PVar1 = 0;
    }
  }
  FILECleanUpLockedRgn(shmFileLocks_00,0,(PVOID)0x0);
LAB_0032fbb6:
  SHMRelease();
  return PVar1;
}

Assistant:

PAL_ERROR
CSharedMemoryFileLockMgr::GetFileShareModeForFile(
   LPCSTR szFileName,
   DWORD* pdwShareMode)
{
    PAL_ERROR palError = NO_ERROR;
    *pdwShareMode = SHARE_MODE_NOT_INITALIZED;
    SHMPTR shmFileLocks = SHMNULL;
    SHMFILELOCKS* fileLocks = NULL;

    SHMLock();

    palError = FILEGetSHMFileLocks(szFileName, &shmFileLocks, TRUE);
    if (NO_ERROR != palError || shmFileLocks == SHMNULL)
    {
        goto GetLockControllerForFileExit;
    }

    if (SHMPTR_TO_TYPED_PTR_BOOL(SHMFILELOCKS, fileLocks, shmFileLocks) == FALSE)
    {
        ASSERT("Unable to get pointer from shm pointer.\n");
        palError = ERROR_INTERNAL_ERROR;
        goto GetLockControllerForFileExit;
    }

    *pdwShareMode = fileLocks->share_mode;

GetLockControllerForFileExit:

    if (SHMNULL != shmFileLocks)
    {
      FILECleanUpLockedRgn(
                shmFileLocks,
                0,
                NULL
                );
    }

    SHMRelease();

    return palError;
}